

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O1

UniValue * find_value(UniValue *obj,string *name)

{
  pointer pbVar1;
  pointer __s2;
  size_t sVar2;
  size_t __n;
  pointer pUVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  
  pbVar1 = (obj->keys).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)(obj->keys).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (lVar7 != 0) {
    __s2 = (name->_M_dataplus)._M_p;
    sVar2 = name->_M_string_length;
    uVar8 = 0;
    uVar6 = 1;
    do {
      __n = pbVar1[uVar8]._M_string_length;
      if ((__n == sVar2) &&
         ((__n == 0 || (iVar5 = bcmp(pbVar1[uVar8]._M_dataplus._M_p,__s2,__n), iVar5 == 0)))) {
        pUVar3 = (obj->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar6 = ((long)(obj->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                       .super__Vector_impl_data._M_finish - (long)pUVar3 >> 3) * 0x2e8ba2e8ba2e8ba3;
        if (uVar6 < uVar8 || uVar6 - uVar8 == 0) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar8);
        }
        return pUVar3 + uVar8;
      }
      bVar4 = uVar6 < (ulong)(lVar7 >> 5);
      uVar8 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar4);
  }
  return &NullUniValue;
}

Assistant:

const UniValue& find_value(const UniValue& obj, const std::string& name)
{
    for (unsigned int i = 0; i < obj.keys.size(); i++)
        if (obj.keys[i] == name)
            return obj.values.at(i);

    return NullUniValue;
}